

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O0

void cache_create(size_t _cache_size,size_t _max_size)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  size_t _max_size_local;
  size_t _cache_size_local;
  
  if (((int)POPCOUNT(_cache_size) != 1) || ((int)POPCOUNT(_max_size) != 1)) {
    fprintf(_stderr,"cache_create: Table size must be a power of 2!\n");
    exit(1);
  }
  cache_mask = _cache_size - 1;
  cache_size = _cache_size;
  cache_max = _max_size;
  if (_max_size < _cache_size) {
    fprintf(_stderr,"cache_create: Table size must be <= max size!\n");
    exit(1);
  }
  cache_table = (cache_entry_t)alloc_aligned(_max_size << 5);
  cache_status = (uint32_t *)alloc_aligned(cache_max << 2);
  __stream = _stderr;
  if ((cache_table != (cache_entry_t)0x0) && (cache_status != (uint32_t *)0x0)) {
    LOCK();
    next_opid = 0x2000000000000;
    UNLOCK();
    return;
  }
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  fprintf(__stream,"cache_create: Unable to allocate memory: %s!\n",pcVar2);
  exit(1);
}

Assistant:

void
cache_create(size_t _cache_size, size_t _max_size)
{
#if CACHE_MASK
    // Cache size must be a power of 2
    if (__builtin_popcountll(_cache_size) != 1 || __builtin_popcountll(_max_size) != 1) {
        fprintf(stderr, "cache_create: Table size must be a power of 2!\n");
        exit(1);
    }
#endif

    cache_size = _cache_size;
    cache_max  = _max_size;
#if CACHE_MASK
    cache_mask = cache_size - 1;
#endif

    if (cache_size > cache_max) {
        fprintf(stderr, "cache_create: Table size must be <= max size!\n");
        exit(1);
    }

    cache_table = (cache_entry_t)alloc_aligned(cache_max * sizeof(struct cache_entry));
    cache_status = (uint32_t*)alloc_aligned(cache_max * sizeof(uint32_t));
    if (cache_table == 0 || cache_status == 0) {
        fprintf(stderr, "cache_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

    next_opid = 512LL << 40;
}